

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_mon_spell_lore_desc(parser *p)

{
  long *plVar1;
  parser_error pVar2;
  void *pvVar3;
  long *plVar4;
  char *s2;
  char *pcVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plVar1 = *(long **)((long)pvVar3 + 0x20);
    do {
      plVar4 = plVar1;
      plVar1 = (long *)*plVar4;
    } while ((long *)*plVar4 != (long *)0x0);
    pcVar5 = (char *)plVar4[2];
    s2 = parser_getstr(p,"text");
    pcVar5 = string_append(pcVar5,s2);
    plVar4[2] = (long)pcVar5;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_mon_spell_lore_desc(struct parser *p) {
	struct monster_spell *s = parser_priv(p);
	struct monster_spell_level *l;

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	l = s->level;
	while (l->next) {
		l = l->next;
	}
	l->lore_desc = string_append(l->lore_desc, parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}